

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall
ON_MeshSeparateNgonInfo::TestNgonVertex(ON_MeshSeparateNgonInfo *this,uint *vertex_index_ptr)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  uint local_54;
  uint local_40;
  uint vfi_local;
  uint vfm_count1;
  uint vfi;
  uint vfmi;
  uint vfm_count0;
  uint *vfm;
  uint n;
  uint *vertex_index_ptr_local;
  ON_MeshSeparateNgonInfo *this_local;
  
  if (vertex_index_ptr == (uint *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this->m_vi = *vertex_index_ptr;
    if (this->m_vi < this->m_vertex_count0) {
      uVar1 = this->m_ngon_vmap[this->m_vi];
      if (this->m_ngon_vmark == uVar1) {
        this_local._7_1_ = true;
      }
      else if ((uVar1 < this->m_vertex_count1) || (this->m_vertex_count2 <= uVar1)) {
        puVar2 = this->m_vertex_face_map[this->m_vi];
        if (puVar2 == (uint *)0x0) {
          local_54 = 0;
          _vfmi = (uint *)0x0;
        }
        else {
          _vfmi = puVar2 + 1;
          local_54 = *puVar2;
        }
        if (local_54 != 0) {
          for (vfm_count1 = 0; vfm_count1 < local_54; vfm_count1 = vfm_count1 + 1) {
            uVar1 = _vfmi[vfm_count1];
            if (((this->m_fi != uVar1) && (uVar1 < this->m_face_count)) &&
               (this->m_ni != this->m_ngondex_from_facedex_map[uVar1])) {
              bVar3 = AddVertexIndexRef(this,vertex_index_ptr,this->m_vertex_count2);
              if (!bVar3) {
                return false;
              }
              this->m_ngon_vmap[this->m_vi] = this->m_vertex_count2;
              this->m_vertex_count2 = this->m_vertex_count2 + 1;
              local_40 = 0;
              for (vfm_count1 = 0; vfm_count1 < local_54; vfm_count1 = vfm_count1 + 1) {
                uVar1 = _vfmi[vfm_count1];
                if ((this->m_fi != uVar1) &&
                   ((this->m_face_count <= uVar1 ||
                    (this->m_ni != this->m_ngondex_from_facedex_map[uVar1])))) {
                  if (local_40 < vfm_count1) {
                    _vfmi[local_40] = uVar1;
                  }
                  local_40 = local_40 + 1;
                }
              }
              _vfmi[-1] = local_40;
              return true;
            }
          }
        }
        this->m_ngon_vmap[this->m_vi] = this->m_ngon_vmark;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = AddVertexIndexRef(this,vertex_index_ptr,uVar1);
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MeshSeparateNgonInfo::TestNgonVertex(
  const unsigned int* vertex_index_ptr
  )
{
  if ( 0 == vertex_index_ptr )
    return false;
  m_vi = *vertex_index_ptr;
  if ( m_vi >= m_vertex_count0 )
  {
    // The source of this vertex index contained a bogus value.
    return true;
  }

  const unsigned int n = m_ngon_vmap[m_vi];
  
  if ( m_ngon_vmark == n )
  {
    // This vertex is known to be referenced only
    // by this ngon and does not need to be tested
    // or duplicated.
    return true;
  }

  if ( m_vertex_count1 <= n && n < m_vertex_count2 )
  {
    // this vertex is flagged for duplication in this ngon.
    return AddVertexIndexRef(vertex_index_ptr,n);
  }

  unsigned int* vfm = m_vertex_face_map[m_vi];
  const unsigned int vfm_count0 = (0 != vfm) ? *vfm++ : 0;
  if ( vfm_count0 > 0 )
  {
    for ( unsigned int vfmi = 0; vfmi < vfm_count0; vfmi++ )
    {
      unsigned int vfi = vfm[vfmi];
      if( m_fi == vfi )
        continue;
      if ( vfi >= m_face_count )
        continue;
      if ( m_ni == m_ngondex_from_facedex_map[vfi] )
        continue; // face[vfi] is in this ngon

      // this vertex is shared by a face not belonging to this ngon.
      if ( false == AddVertexIndexRef(vertex_index_ptr,m_vertex_count2) )
        return false;
      m_ngon_vmap[m_vi] = m_vertex_count2;
      m_vertex_count2++;

      // Any faces in this ngon that reference vertex m_vi
      // will be modified to reference vertex m_vertex_count2.
      // These faces need to be removed from vfm[], so
      // future searches for faces that share vertex m_vi
      // will be correct.
      unsigned int vfm_count1 = 0;
      for ( vfmi = 0; vfmi < vfm_count0; vfmi++ )
      {
        unsigned int vfi_local = vfm[vfmi];
        if( m_fi == vfi_local )
          continue;
        if ( vfi_local < m_face_count && m_ni == m_ngondex_from_facedex_map[vfi_local] )
          continue; // face[vfi_local] is in this ngon
        if ( vfmi > vfm_count1 )
          vfm[vfm_count1] = vfi_local;
        vfm_count1++;
      }
      vfm[-1] = vfm_count1;
      return true;
    }
  }

  // vertex is not shared
  m_ngon_vmap[m_vi] = m_ngon_vmark;
  return true;
}